

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

Address * __thiscall
cfd::AddressFactory::GetAddressByHash(AddressFactory *this,AddressType address_type,ByteData *hash)

{
  ByteData *in_RCX;
  undefined4 in_EDX;
  AddressFactory *in_RSI;
  Address *in_RDI;
  Address *pAVar1;
  undefined4 in_stack_ffffffffffffff90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ByteData160 local_38 [2];
  
  pAVar1 = in_RDI;
  core::ByteData::GetBytes(&local_50,in_RCX);
  core::ByteData160::ByteData160(local_38,&local_50);
  GetAddressByHash(in_RSI,(AddressType)((ulong)pAVar1 >> 0x20),(ByteData160 *)in_RDI);
  core::ByteData160::~ByteData160((ByteData160 *)0x5260c3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffff90));
  return pAVar1;
}

Assistant:

Address AddressFactory::GetAddressByHash(
    AddressType address_type, const ByteData& hash) const {
  return GetAddressByHash(address_type, ByteData160(hash.GetBytes()));
}